

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O1

void __thiscall ghc::filesystem::path::iterator::updateCurrent(iterator *this)

{
  path *p;
  char *pcVar1;
  char *pcVar2;
  ulong uVar3;
  format fmt;
  
  pcVar1 = (this->_iter)._M_current;
  if (((pcVar1 != (this->_first)._M_current) &&
      (pcVar2 = (this->_last)._M_current, pcVar1 != pcVar2)) &&
     ((pcVar1 + 1 == pcVar2 && pcVar1 != (this->_root)._M_current) && *pcVar1 == '/')) {
    assign<char[1]>(&this->_current,(char (*) [1])0x19115e);
    return;
  }
  p = &this->_current;
  increment(this,&this->_iter);
  fmt = generic_format;
  std::__cxx11::string::replace
            ((ulong)p,0,(char *)(this->_current)._path._M_string_length,(ulong)pcVar1);
  postprocess_path_with_format(&p->_path,fmt);
  uVar3 = (this->_current)._path._M_string_length;
  if (((1 < uVar3) && (pcVar1 = (p->_path)._M_dataplus._M_p, *pcVar1 == '/')) &&
     (pcVar1[uVar3 - 1] == '/')) {
    assign<char[2]>(p,(char (*) [2])"/");
    return;
  }
  return;
}

Assistant:

GHC_INLINE void path::iterator::updateCurrent()
{
    if (_iter != _first && _iter != _last && (*_iter == '/' && _iter != _root) && (_iter + 1 == _last)) {
        _current = "";
    }
    else {
        _current.assign(_iter, increment(_iter));
        if (_current.generic_string().size() > 1 && _current.generic_string()[0] == '/' && _current.generic_string()[_current.generic_string().size() - 1] == '/') {
            // shrink successive slashes to one
            _current = "/";
        }
    }
}